

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_permute_cols(m2v *M,int *colperm)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int i;
  ulong uVar5;
  undefined8 uStack_60;
  m2v_base amStack_58 [2];
  undefined1 local_50 [8];
  m2v colbuf_mat;
  
  uVar1 = M->n_col;
  uVar5 = (ulong)uVar1;
  colbuf_mat.e = (m2v_base *)((long)amStack_58 - (uVar5 + 0xf & 0xfffffffffffffff0));
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    *(undefined1 *)((long)colbuf_mat.e + uVar2) = 0;
  }
  local_50._0_4_ = M->n_row;
  lVar4 = (long)colbuf_mat.e - ((ulong)(uint)local_50._0_4_ * 4 + 0xf & 0xfffffffffffffff0);
  local_50._4_4_ = 1;
  colbuf_mat.n_row = 1;
  colbuf_mat._8_8_ = lVar4;
  for (uVar2 = 0; (long)uVar2 < (long)(int)uVar5; uVar2 = uVar2 + 1) {
    if (*(char *)((long)colbuf_mat.e + uVar2) == '\0') {
      if (uVar2 == (uint)colperm[uVar2]) {
        *(undefined1 *)((long)colbuf_mat.e + uVar2) = 1;
      }
      else {
        *(undefined8 *)(lVar4 + -8) = 0x102e04;
        m2v_copy_col(M,(int)uVar2,(m2v *)local_50,0);
        uVar3 = uVar2 & 0xffffffff;
        uVar5 = uVar2;
        while( true ) {
          uVar1 = colperm[uVar5];
          if (uVar2 == uVar1) break;
          uVar5 = (ulong)(int)uVar1;
          *(undefined1 *)((long)colbuf_mat.e + uVar5) = 1;
          *(undefined8 *)(lVar4 + -8) = 0x102e2a;
          m2v_copy_col(M,uVar1,M,(int)uVar3);
          uVar3 = (ulong)uVar1;
        }
        *(undefined1 *)((long)colbuf_mat.e + uVar2) = 1;
        *(undefined8 *)(lVar4 + -8) = 0x102e4c;
        m2v_copy_col((m2v *)local_50,0,M,(int)uVar3);
        uVar5 = (ulong)(uint)M->n_col;
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_cols)(MV_GEN_TYPE* M, const int* colperm)
{
	char visited[M->n_col];
	for (int i = 0; i < M->n_col; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(colbuf_mat, colbuf, M->n_row, 1);
	for (int i = 0; i < M->n_col; ++i) {
		if (visited[i])
			continue;
		if (colperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_col)(M, i, &colbuf_mat, 0);
		int e = i, e_next = colperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_col)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = colperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_col)(&colbuf_mat, 0, M, e);
	}
}